

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  char *xml_output_file_env;
  allocator<char> local_12;
  undefined1 local_11;
  string *default_value_for_output_flag;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator(&local_12);
  local_30 = posix::GetEnv("XML_OUTPUT_FILE");
  if (local_30 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"xml:",&local_71);
    std::operator+(&local_50,&local_70,local_30);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (NULL != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}